

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ClosePopupsExceptModals(void)

{
  ImGuiContext *pIVar1;
  ImGuiPopupData *pIVar2;
  ImGuiWindow *window;
  int popup_count_to_keep;
  ImGuiContext *g;
  bool in_stack_00000043;
  int in_stack_00000044;
  int local_c;
  
  pIVar1 = GImGui;
  for (local_c = (GImGui->OpenPopupStack).Size; 0 < local_c; local_c = local_c + -1) {
    pIVar2 = ImVector<ImGuiPopupData>::operator[](&pIVar1->OpenPopupStack,local_c + -1);
    if ((pIVar2->Window == (ImGuiWindow *)0x0) || ((pIVar2->Window->Flags & 0x8000000U) != 0))
    break;
  }
  if (local_c < (pIVar1->OpenPopupStack).Size) {
    ClosePopupToLevel(in_stack_00000044,in_stack_00000043);
  }
  return;
}

Assistant:

void ImGui::ClosePopupsExceptModals()
{
    ImGuiContext& g = *GImGui;

    int popup_count_to_keep;
    for (popup_count_to_keep = g.OpenPopupStack.Size; popup_count_to_keep > 0; popup_count_to_keep--)
    {
        ImGuiWindow* window = g.OpenPopupStack[popup_count_to_keep - 1].Window;
        if (!window || (window->Flags & ImGuiWindowFlags_Modal))
            break;
    }
    if (popup_count_to_keep < g.OpenPopupStack.Size) // This test is not required but it allows to set a convenient breakpoint on the statement below
        ClosePopupToLevel(popup_count_to_keep, true);
}